

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

CappedArray<char,_8UL> __thiscall kj::_::Stringifier::operator*(Stringifier *this,unsigned_short i)

{
  ulong uVar1;
  size_t sVar2;
  uint8_t *puVar3;
  undefined6 in_register_00000032;
  CappedArray<char,_8UL> CVar4;
  uint8_t reverse [7];
  CappedArray<char,_8UL> result;
  
  result.currentSize = 8;
  reverse[4] = '\0';
  reverse[5] = '\0';
  reverse[6] = '\0';
  reverse[0] = '\0';
  reverse[1] = '\0';
  reverse[2] = '\0';
  reverse[3] = '\0';
  if ((int)CONCAT62(in_register_00000032,i) == 0) {
    puVar3 = reverse + 1;
  }
  else {
    puVar3 = reverse;
    for (uVar1 = (ulong)i; (int)uVar1 != 0; uVar1 = uVar1 / 10) {
      *puVar3 = (uint8_t)(uVar1 % 10);
      puVar3 = puVar3 + 1;
    }
  }
  sVar2 = 0;
  for (; reverse < puVar3; puVar3 = puVar3 + -1) {
    result.content[sVar2] = puVar3[-1] + '0';
    sVar2 = sVar2 + 1;
  }
  CVar4.content[0] = result.content[0];
  CVar4.content[1] = result.content[1];
  CVar4.content[2] = result.content[2];
  CVar4.content[3] = result.content[3];
  CVar4.content[4] = result.content[4];
  CVar4.content[5] = result.content[5];
  CVar4.content[6] = result.content[6];
  CVar4.content[7] = result.content[7];
  CVar4.currentSize = sVar2;
  return CVar4;
}

Assistant:

inline explicit constexpr CappedArray(size_t s): currentSize(s) {}